

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void MeCab::enum_csv_dictionaries
               (char *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  string ext;
  string tmp;
  dirent *dp;
  DIR *dir;
  value_type *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  allocator *in_stack_fffffffffffffed0;
  string *file;
  string *path_00;
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [39];
  allocator local_59;
  string local_58 [32];
  dirent *local_38;
  byte local_1a;
  die local_19;
  DIR *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x125704);
  local_18 = opendir(local_8);
  local_1a = 0;
  if (local_18 == (DIR *)0x0) {
    die::die(&local_19);
    local_1a = 1;
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/utils.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xed);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"dir");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"no such directory: ");
    poVar3 = std::operator<<(poVar3,local_8);
    die::operator&(&local_19,poVar3);
  }
  if ((local_1a & 1) != 0) {
    die::~die((die *)0x125839);
  }
  local_38 = readdir(local_18);
  while (local_38 != (dirent *)0x0) {
    path_00 = (string *)local_38->d_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)path_00,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    uVar4 = std::__cxx11::string::size();
    if (4 < uVar4) {
      file = local_58;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_80,(ulong)file);
      toLower((string *)in_stack_fffffffffffffed0);
      bVar2 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      pcVar1 = local_8;
      if (bVar2) {
        in_stack_fffffffffffffed0 = &local_c1;
        in_stack_fffffffffffffec0 = local_10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,pcVar1,in_stack_fffffffffffffed0);
        create_filename(path_00,(string *)file);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      }
      std::__cxx11::string::~string(local_80);
    }
    std::__cxx11::string::~string(local_58);
    local_38 = readdir(local_18);
  }
  closedir(local_18);
  return;
}

Assistant:

void enum_csv_dictionaries(const char *path,
                           std::vector<std::string> *dics) {
  dics->clear();

#if defined(_WIN32) && !defined(__CYGWIN__)
  WIN32_FIND_DATAW wfd;
  HANDLE hFind;
  const std::wstring pat = Utf8ToWide(create_filename(path, "*.csv"));
  hFind = ::FindFirstFileW(pat.c_str(), &wfd);
  CHECK_DIE(hFind != INVALID_HANDLE_VALUE)
      << "Invalid File Handle. Get Last Error reports";
  do {
    std::string tmp = create_filename(path, WideToUtf8(wfd.cFileName));
    dics->push_back(tmp);
  } while (::FindNextFileW(hFind, &wfd));
  ::FindClose(hFind);
#else
  DIR *dir = opendir(path);
  CHECK_DIE(dir) << "no such directory: " << path;

  for (struct dirent *dp = readdir(dir);
       dp;
       dp = readdir(dir)) {
    const std::string tmp = dp->d_name;
    if (tmp.size() >= 5) {
      std::string ext = tmp.substr(tmp.size() - 4, 4);
      toLower(&ext);
      if (ext == ".csv") {
        dics->push_back(create_filename(path, tmp));
      }
    }
  }
  closedir(dir);
#endif
}